

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O2

void __thiscall
hbm::streaming::SubscribedSignal::processSignalMetaInformation
          (SubscribedSignal *this,string *method,Value *params)

{
  string *__return_storage_ptr__;
  bool bVar1;
  Value *this_00;
  ostream *poVar2;
  size_t in_RCX;
  undefined1 auStack_a8 [144];
  
  bVar1 = std::operator==(method,"subscribe");
  if (bVar1) {
    bVar1 = Json::Value::empty(params);
    if (!bVar1) {
      this_00 = Json::Value::operator[](params,0);
      __return_storage_ptr__ = (string *)(auStack_a8 + 0x20);
      Json::Value::asString_abi_cxx11_(__return_storage_ptr__,this_00);
      std::__cxx11::string::operator=
                ((string *)&this->m_signalReference,(string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  else {
    bVar1 = std::operator==(method,"time");
    if (bVar1) {
      deltaTimeInfo::setTime(&this->m_syncSignalTime,params);
      return;
    }
    bVar1 = std::operator==(method,"data");
    if (bVar1) {
      setDataFormat(this,params);
      return;
    }
    bVar1 = std::operator==(method,"signalRate");
    if (bVar1) {
      Json::StyledWriter::StyledWriter((StyledWriter *)(auStack_a8 + 0x20));
      Json::StyledWriter::write_abi_cxx11_
                ((StyledWriter *)auStack_a8,(int)auStack_a8 + 0x20,params,in_RCX);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)auStack_a8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)auStack_a8);
      Json::StyledWriter::~StyledWriter((StyledWriter *)(auStack_a8 + 0x20));
      deltaTimeInfo::setDelta(&this->m_syncSignalTime,params);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"unhandled signal related meta information \'")
      ;
      poVar2 = std::operator<<(poVar2,(string *)method);
      poVar2 = std::operator<<(poVar2,"\' for signal ");
      poVar2 = std::operator<<(poVar2,(string *)&this->m_signalReference);
      poVar2 = std::operator<<(poVar2," with parameters: ");
      Json::StyledWriter::StyledWriter((StyledWriter *)(auStack_a8 + 0x20));
      Json::StyledWriter::write_abi_cxx11_
                ((StyledWriter *)auStack_a8,(int)(StyledWriter *)(auStack_a8 + 0x20),params,in_RCX);
      poVar2 = std::operator<<(poVar2,(string *)auStack_a8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)auStack_a8);
      Json::StyledWriter::~StyledWriter((StyledWriter *)(auStack_a8 + 0x20));
    }
  }
  return;
}

Assistant:

void SubscribedSignal::processSignalMetaInformation(const std::string& method, const Json::Value& params)
		{
			if(method=="subscribe") {
				/// this is the first signal related meta information to arrive!
				if(params.empty()==false) {
					m_signalReference = params[0u].asString();
				}
			} else if(method=="time") {
				m_syncSignalTime.setTime(params);
			} else if(method=="data") {
				setDataFormat(params);
			} else if(method=="signalRate") {
				try {
					std::cout << Json::StyledWriter().write(params) << std::endl;
					m_syncSignalTime.setDelta(params);
				} catch(const std::runtime_error& e) {
					std::cerr << e.what();
				}
			} else {
				std::cout << "unhandled signal related meta information '" << method << "' for signal " << m_signalReference << " with parameters: " << Json::StyledWriter().write(params) << std::endl;
			}
		}